

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-window.cc
# Opt level: O2

void __thiscall Debugger::IOWindow::Tick(IOWindow *this)

{
  Emulator *pEVar1;
  BitArg args;
  BitArg args_00;
  BitArg args_1;
  BitArg args_1_00;
  BitArg args_2;
  BitArg args_2_00;
  BitArg args_01;
  BitArg args_02;
  BitArg args_3;
  BitArg args_3_00;
  BitArg args_1_01;
  BitArg args_1_02;
  BitArg args_4;
  BitArg args_4_00;
  BitArg args_2_01;
  BitArg args_2_02;
  BitArg args_5;
  BitArg args_5_00;
  BitArg args_3_01;
  BitArg args_3_02;
  BitArg args_6;
  BitArg args_6_00;
  BitArg arg;
  BitArg arg_00;
  BitArg args_4_01;
  BitArg arg_01;
  BitArg args_03;
  BitArg args_04;
  BitArg args_4_02;
  BitArg args_7;
  undefined1 auVar2 [32];
  BitArg args_7_00;
  BitArg args_05;
  BitArg args_06;
  CgbSwatchArg args_2_03;
  CgbSwatchArg args_2_04;
  CgbSwatchArg args_2_05;
  CgbSwatchArg args_2_06;
  CgbSwatchArg args_2_07;
  CgbSwatchArg args_2_08;
  CgbSwatchArg args_2_09;
  CgbSwatchArg args_2_10;
  CgbSwatchArg args_2_11;
  CgbSwatchArg args_2_12;
  CgbSwatchArg args_2_13;
  CgbSwatchArg args_2_14;
  CgbSwatchArg args_2_15;
  CgbSwatchArg args_2_16;
  CgbSwatchArg args_2_17;
  CgbSwatchArg args_3_03;
  CgbSwatchArg args_3_04;
  CgbSwatchArg args_3_05;
  CgbSwatchArg args_3_06;
  CgbSwatchArg args_3_07;
  CgbSwatchArg args_3_08;
  CgbSwatchArg args_3_09;
  CgbSwatchArg args_3_10;
  CgbSwatchArg args_3_11;
  CgbSwatchArg args_3_12;
  CgbSwatchArg args_3_13;
  CgbSwatchArg args_3_14;
  CgbSwatchArg args_3_15;
  CgbSwatchArg args_3_16;
  CgbSwatchArg args_3_17;
  bool bVar3;
  byte bVar4;
  Debugger *pDVar5;
  u8 uVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *pcVar9;
  IntArg args_07;
  IntArg arg_02;
  IntArg args_08;
  IntArg args_09;
  IntArg args_1_03;
  IntArg args_1_04;
  CgbSwatchArg args_1_05;
  CgbSwatchArg args_1_06;
  CgbSwatchArg args_1_07;
  CgbSwatchArg args_1_08;
  CgbSwatchArg args_1_09;
  CgbSwatchArg args_1_10;
  CgbSwatchArg args_1_11;
  CgbSwatchArg args_1_12;
  CgbSwatchArg args_1_13;
  CgbSwatchArg args_1_14;
  CgbSwatchArg args_1_15;
  CgbSwatchArg args_1_16;
  CgbSwatchArg args_1_17;
  CgbSwatchArg args_1_18;
  CgbSwatchArg args_1_19;
  undefined4 uVar10;
  undefined1 local_608 [8];
  undefined8 uStack_600;
  char *local_5f8;
  char *pcStack_5f0;
  undefined1 local_5e8;
  undefined7 uStack_5e7;
  ImVec4 local_5d8;
  undefined8 local_5c8;
  undefined4 local_5c0;
  undefined8 local_5b8;
  undefined4 local_5b0;
  undefined8 local_5a8;
  undefined4 local_5a0;
  undefined8 local_598;
  undefined4 local_590;
  undefined8 local_588;
  undefined4 local_580;
  undefined8 local_578;
  undefined4 local_570;
  undefined8 local_568;
  undefined4 local_560;
  undefined8 local_558;
  undefined4 local_550;
  undefined8 local_548;
  undefined4 local_540;
  undefined8 local_538;
  undefined4 local_530;
  undefined8 local_528;
  undefined4 local_520;
  undefined8 local_518;
  undefined4 local_510;
  undefined8 local_508;
  undefined4 local_500;
  undefined8 local_4f8;
  undefined4 local_4f0;
  undefined8 local_4e8;
  undefined4 local_4e0;
  undefined8 local_4d8;
  undefined4 local_4d0;
  undefined1 local_4c8;
  undefined7 uStack_4c7;
  char *pcStack_4c0;
  char *local_4b8;
  undefined8 uStack_4b0;
  undefined1 local_4a8;
  uint7 uStack_4a7;
  undefined1 local_4a0;
  undefined7 uStack_49f;
  char *pcStack_498;
  char *local_490;
  undefined8 uStack_488;
  undefined1 local_480;
  uint7 uStack_47f;
  undefined1 local_478;
  undefined7 uStack_477;
  char *pcStack_470;
  char *local_468;
  undefined8 uStack_460;
  undefined1 local_458;
  uint7 uStack_457;
  undefined1 local_450;
  undefined7 uStack_44f;
  char *pcStack_448;
  char *local_440;
  undefined8 uStack_438;
  undefined1 local_430;
  uint7 uStack_42f;
  undefined1 local_428;
  undefined7 uStack_427;
  char *pcStack_420;
  char *local_418;
  undefined8 uStack_410;
  undefined1 local_408;
  uint7 uStack_407;
  undefined1 local_400;
  undefined7 uStack_3ff;
  char *pcStack_3f8;
  char *local_3f0;
  char *pcStack_3e8;
  undefined1 local_3e0;
  uint7 uStack_3df;
  undefined1 local_3d8;
  undefined7 uStack_3d7;
  char *pcStack_3d0;
  char *local_3c8;
  char *pcStack_3c0;
  undefined1 local_3b8;
  uint7 uStack_3b7;
  undefined1 local_3b0;
  undefined7 uStack_3af;
  char *pcStack_3a8;
  char *local_3a0;
  char *pcStack_398;
  undefined1 local_390;
  undefined7 uStack_38f;
  undefined1 local_388;
  undefined7 uStack_387;
  char *pcStack_380;
  char *local_378;
  char *pcStack_370;
  undefined1 local_368;
  uint7 uStack_367;
  undefined1 local_360;
  undefined7 uStack_35f;
  char *pcStack_358;
  char *local_350;
  char *pcStack_348;
  undefined1 local_340;
  uint7 uStack_33f;
  undefined1 local_338;
  undefined7 uStack_337;
  char *pcStack_330;
  char *local_328;
  char *pcStack_320;
  undefined1 local_318;
  uint7 uStack_317;
  undefined1 local_310;
  undefined7 uStack_30f;
  char *pcStack_308;
  char *local_300;
  char *pcStack_2f8;
  undefined1 local_2f0;
  uint7 uStack_2ef;
  undefined1 local_2e8;
  undefined7 uStack_2e7;
  char *pcStack_2e0;
  char *local_2d8;
  char *pcStack_2d0;
  undefined1 local_2c8;
  uint7 uStack_2c7;
  undefined1 local_2c0;
  undefined7 uStack_2bf;
  char *pcStack_2b8;
  char *local_2b0;
  char *pcStack_2a8;
  undefined1 local_2a0;
  uint7 uStack_29f;
  undefined1 local_298;
  undefined7 uStack_297;
  char *pcStack_290;
  char *local_288;
  char *pcStack_280;
  undefined1 local_278;
  uint7 uStack_277;
  undefined1 local_270;
  undefined7 uStack_26f;
  char *pcStack_268;
  char *local_260;
  undefined8 uStack_258;
  undefined1 local_250;
  uint7 uStack_24f;
  undefined1 local_248;
  undefined7 uStack_247;
  char *pcStack_240;
  char *local_238;
  undefined8 uStack_230;
  undefined1 local_228;
  uint7 uStack_227;
  undefined1 local_220;
  undefined7 uStack_21f;
  char *pcStack_218;
  char *local_210;
  undefined8 uStack_208;
  undefined1 local_200;
  uint7 uStack_1ff;
  undefined1 local_1f8;
  undefined7 uStack_1f7;
  char *pcStack_1f0;
  char *local_1e8;
  undefined8 uStack_1e0;
  undefined1 local_1d8;
  uint7 uStack_1d7;
  undefined1 local_1d0;
  undefined7 uStack_1cf;
  char *pcStack_1c8;
  char *local_1c0;
  undefined8 uStack_1b8;
  undefined1 local_1b0;
  uint7 uStack_1af;
  undefined1 local_1a8;
  undefined7 uStack_1a7;
  char *pcStack_1a0;
  char *local_198;
  undefined8 uStack_190;
  undefined1 local_188;
  undefined7 uStack_187;
  undefined1 local_180;
  undefined7 uStack_17f;
  char *pcStack_178;
  char *local_170;
  undefined8 uStack_168;
  undefined1 local_160;
  undefined7 uStack_15f;
  undefined1 local_158;
  undefined7 uStack_157;
  char *pcStack_150;
  char *local_148;
  undefined8 uStack_140;
  undefined1 local_138;
  undefined7 uStack_137;
  undefined1 local_130;
  undefined7 uStack_12f;
  char *pcStack_128;
  char *local_120;
  undefined8 uStack_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  undefined1 local_108;
  undefined7 uStack_107;
  char *pcStack_100;
  char *local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8;
  undefined7 uStack_e7;
  undefined1 local_e0;
  undefined7 uStack_df;
  char *pcStack_d8;
  char *local_d0;
  undefined8 uStack_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  undefined1 local_b8;
  undefined7 uStack_b7;
  char *pcStack_b0;
  char *local_a8;
  undefined8 uStack_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  undefined1 local_90;
  undefined7 uStack_8f;
  char *pcStack_88;
  char *local_80;
  undefined8 uStack_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  char local_62 [10];
  undefined1 local_58 [8];
  char *pcStack_50;
  char *local_48;
  char *pcStack_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  if ((this->super_Window).is_open == true) {
    bVar3 = ImGui::Begin("IO",&(this->super_Window).is_open,0);
    if (bVar3) {
      local_90 = 0x18;
      pcStack_88 = "D";
      local_80 = "_";
      uStack_78 = 0;
      local_70 = 1;
      local_b8 = 0x14;
      pcStack_b0 = "U";
      local_a8 = "_";
      uStack_a0 = 0;
      local_98 = 1;
      local_e0 = 0x12;
      pcStack_d8 = "L";
      local_d0 = "_";
      uStack_c8 = 0;
      local_c0 = 1;
      local_108 = 0x11;
      pcStack_100 = "R";
      local_f8 = "_";
      uStack_f0 = 0;
      local_e8 = 1;
      local_130 = 0x28;
      pcStack_128 = "+";
      local_120 = "_";
      uStack_118 = 0;
      local_110 = 1;
      local_158 = 0x24;
      pcStack_150 = "-";
      local_148 = "_";
      uStack_140 = 0;
      local_138 = 1;
      local_180 = 0x22;
      pcStack_178 = "B";
      local_170 = "_";
      uStack_168 = 0;
      local_160 = 1;
      local_1a8 = 0x21;
      pcStack_1a0 = "A";
      local_198 = "_";
      uStack_190 = 0;
      local_188 = 1;
      args_6._33_7_ = uStack_15f;
      args_6.invert = true;
      args_6._1_7_ = uStack_17f;
      args_6.mask = 0x22;
      args_5._33_7_ = uStack_137;
      args_5.invert = true;
      args_5._1_7_ = uStack_157;
      args_5.mask = 0x24;
      args_4._33_7_ = uStack_10f;
      args_4.invert = true;
      args_4._1_7_ = uStack_12f;
      args_4.mask = 0x28;
      args_3._33_7_ = uStack_e7;
      args_3.invert = true;
      args_3._1_7_ = uStack_107;
      args_3.mask = 0x11;
      args_2._33_7_ = uStack_bf;
      args_2.invert = true;
      args_2._1_7_ = uStack_df;
      args_2.mask = 0x12;
      args_1._33_7_ = uStack_97;
      args_1.invert = true;
      args_1._1_7_ = uStack_b7;
      args_1.mask = 0x14;
      args._33_7_ = uStack_6f;
      args.invert = true;
      args._1_7_ = uStack_8f;
      args.mask = 0x18;
      args.true_text = "D";
      args.false_text = "_";
      args.tooltip = (char *)0x0;
      args_1.true_text = "U";
      args_1.false_text = "_";
      args_1.tooltip = (char *)0x0;
      args_2.true_text = "L";
      args_2.false_text = "_";
      args_2.tooltip = (char *)0x0;
      args_3.true_text = "R";
      args_3.false_text = "_";
      args_3.tooltip = (char *)0x0;
      args_4.true_text = "+";
      args_4.false_text = "_";
      args_4.tooltip = (char *)0x0;
      args_5.true_text = "-";
      args_5.false_text = "_";
      args_5.tooltip = (char *)0x0;
      args_6.true_text = "B";
      args_6.false_text = "_";
      args_6.tooltip = (char *)0x0;
      auVar2 = ZEXT2032(CONCAT416(0x1bc78c,CONCAT88("A",CONCAT71(uStack_1a7,0x21))));
      args_7._32_4_ = (int)CONCAT71(uStack_187,1);
      args_7.mask = auVar2[0];
      args_7._1_7_ = auVar2._1_7_;
      args_7.true_text = (char *)auVar2._8_8_;
      args_7.false_text = (char *)auVar2._16_8_;
      args_7.tooltip = (char *)auVar2._24_8_;
      args_7._36_4_ = (int)((uint7)uStack_187 >> 0x18);
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg>
                (((this->super_Window).d)->e,0xff00,"JOYP",args,args_1,args_2,args_3,args_4,args_5,
                 args_6,args_7);
      anon_unknown.dwarf_a07a8::TextReg<>(((this->super_Window).d)->e,0xff01,"SB");
      anon_unknown.dwarf_a07a8::TextReg<>(((this->super_Window).d)->e,0xff02,"SC");
      anon_unknown.dwarf_a07a8::TextReg<>(((this->super_Window).d)->e,0xff04,"DIV");
      anon_unknown.dwarf_a07a8::TextReg<>(((this->super_Window).d)->e,0xff05,"TIMA");
      anon_unknown.dwarf_a07a8::TextReg<>(((this->super_Window).d)->e,0xff06,"TMA");
      pEVar1 = ((this->super_Window).d)->e;
      local_608._0_4_ = 1.0;
      local_608._4_4_ = 0.75;
      uStack_600._0_4_ = 0.3;
      uStack_600._4_4_ = 1.0;
      snprintf(local_58,10,"[%s]","TAC");
      bVar4 = emulator_read_u8_raw(pEVar1,0xff07);
      ImGui::Text("0x%04X%8s:",0xff07,local_58);
      ImGui::SameLine(0.0,-1.0);
      ImGui::TextColored((ImVec4 *)local_608,"%02X ",(ulong)bVar4);
      pcVar8 = "on";
      if ((bVar4 & 4) == 0) {
        pcVar8 = "off";
      }
      if (*pcVar8 != '\0') {
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%s",pcVar8);
      }
      ImGui::SameLine(0.0,-1.0);
      ImGui::Text("%s ",&DAT_001bc504 + *(int *)(&DAT_001bc504 + (ulong)(bVar4 & 3) * 4));
      local_1d0 = 0x10;
      pcStack_1c8 = "JOYP ";
      local_1c0 = "";
      uStack_1b8 = 0;
      local_1f8 = 8;
      pcStack_1f0 = "SERIAL ";
      local_1e8 = "";
      uStack_1e0 = 0;
      local_220 = 4;
      pcStack_218 = "TIMER ";
      local_210 = "";
      uStack_208 = 0;
      local_1b0 = 0;
      local_1d8 = 0;
      local_200 = 0;
      local_248 = 2;
      pcStack_240 = "STAT ";
      local_238 = "";
      uStack_230 = 0;
      local_228 = 0;
      local_270 = 1;
      pcStack_268 = "VBLANK ";
      local_260 = "";
      uStack_258 = 0;
      local_250 = 0;
      args_4_01._1_7_ = uStack_26f;
      args_4_01.mask = 1;
      args_3_01._1_7_ = uStack_247;
      args_3_01.mask = 2;
      args_2_01._1_7_ = uStack_21f;
      args_2_01.mask = 4;
      args_1_01._1_7_ = uStack_1f7;
      args_1_01.mask = 8;
      args_01._1_7_ = uStack_1cf;
      args_01.mask = 0x10;
      args_01.true_text = "JOYP ";
      args_01.false_text = "";
      args_01.tooltip = (char *)0x0;
      args_01._32_8_ = (ulong)uStack_1af << 8;
      args_1_01.true_text = "SERIAL ";
      args_1_01.false_text = "";
      args_1_01.tooltip = (char *)0x0;
      args_1_01._32_8_ = (ulong)uStack_1d7 << 8;
      args_2_01.true_text = "TIMER ";
      args_2_01.false_text = "";
      args_2_01.tooltip = (char *)0x0;
      args_2_01._32_8_ = (ulong)uStack_1ff << 8;
      args_3_01.true_text = "STAT ";
      args_3_01.false_text = "";
      args_3_01.tooltip = (char *)0x0;
      args_3_01._32_8_ = (ulong)uStack_227 << 8;
      args_4_01.true_text = "VBLANK ";
      args_4_01.false_text = "";
      args_4_01.tooltip = (char *)0x0;
      args_4_01._32_8_ = (ulong)uStack_24f << 8;
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg>
                (((this->super_Window).d)->e,0xff0f,"IF",args_01,args_1_01,args_2_01,args_3_01,
                 args_4_01);
      local_298 = 0x80;
      pcStack_290 = "D ";
      local_288 = "__";
      pcStack_280 = "Display";
      local_278 = 0;
      local_2c0 = 0x40;
      pcStack_2b8 = "WM";
      local_2b0 = "__";
      pcStack_2a8 = "Window tile map select";
      local_2a0 = 0;
      local_2e8 = 0x20;
      pcStack_2e0 = "Wd";
      local_2d8 = "__";
      pcStack_2d0 = "Window display";
      local_2c8 = 0;
      local_310 = 0x10;
      pcStack_308 = "BD";
      local_300 = "__";
      pcStack_2f8 = "BG tile data select";
      local_2f0 = 0;
      local_338 = 8;
      pcStack_330 = "BM";
      local_328 = "__";
      pcStack_320 = "BG tile map select";
      local_318 = 0;
      local_360 = 4;
      pcStack_358 = "Os";
      local_350 = "__";
      pcStack_348 = "Obj size";
      local_340 = 0;
      local_388 = 2;
      pcStack_380 = "Od";
      local_378 = "__";
      pcStack_370 = "Obj display";
      local_368 = 0;
      local_3b0 = 1;
      pcStack_3a8 = "Bd";
      local_3a0 = "__";
      pcStack_398 = "BG display";
      local_390 = 0;
      args_7_00._1_7_ = uStack_3af;
      args_7_00.mask = 1;
      args_6_00._1_7_ = uStack_387;
      args_6_00.mask = 2;
      args_5_00._1_7_ = uStack_35f;
      args_5_00.mask = 4;
      args_4_00._1_7_ = uStack_337;
      args_4_00.mask = 8;
      args_3_00._1_7_ = uStack_30f;
      args_3_00.mask = 0x10;
      args_2_00._1_7_ = uStack_2e7;
      args_2_00.mask = 0x20;
      args_1_00._1_7_ = uStack_2bf;
      args_1_00.mask = 0x40;
      args_00._1_7_ = uStack_297;
      args_00.mask = 0x80;
      args_00.true_text = "D ";
      args_00.false_text = "__";
      args_00.tooltip = "Display";
      args_00._32_8_ = (ulong)uStack_277 << 8;
      args_1_00.true_text = "WM";
      args_1_00.false_text = "__";
      args_1_00.tooltip = "Window tile map select";
      args_1_00._32_8_ = (ulong)uStack_29f << 8;
      args_2_00.true_text = "Wd";
      args_2_00.false_text = "__";
      args_2_00.tooltip = "Window display";
      args_2_00._32_8_ = (ulong)uStack_2c7 << 8;
      args_3_00.true_text = "BD";
      args_3_00.false_text = "__";
      args_3_00.tooltip = "BG tile data select";
      args_3_00._32_8_ = (ulong)uStack_2ef << 8;
      args_4_00.true_text = "BM";
      args_4_00.false_text = "__";
      args_4_00.tooltip = "BG tile map select";
      args_4_00._32_8_ = (ulong)uStack_317 << 8;
      args_5_00.true_text = "Os";
      args_5_00.false_text = "__";
      args_5_00.tooltip = "Obj size";
      args_5_00._32_8_ = (ulong)uStack_33f << 8;
      args_6_00.true_text = "Od";
      args_6_00.false_text = "__";
      args_6_00.tooltip = "Obj display";
      args_6_00._32_8_ = (ulong)uStack_367 << 8;
      args_7_00.true_text = "Bd";
      args_7_00.false_text._0_4_ = 0x1bc78b;
      args_7_00.false_text._4_4_ = 0;
      args_7_00.tooltip = "BG display";
      args_7_00._32_4_ = (int)uStack_38f << 8;
      args_7_00._36_4_ = (int)((uint7)uStack_38f >> 0x18);
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg>
                (((this->super_Window).d)->e,0xff40,"LCDC",args_00,args_1_00,args_2_00,args_3_00,
                 args_4_00,args_5_00,args_6_00,args_7_00);
      pEVar1 = ((this->super_Window).d)->e;
      local_608[0] = 4;
      uStack_600 = "Y=";
      local_5f8 = "__";
      pcStack_5f0 = "Y compare set";
      local_5e8 = 0;
      local_58._0_4_ = 1.0;
      local_58._4_4_ = 0.75;
      pcStack_50 = (char *)0x3f8000003e99999a;
      pcVar8 = "STAT";
      snprintf((char *)&local_5d8,10,"[%s]");
      bVar4 = emulator_read_u8_raw(pEVar1,0xff41);
      ImGui::Text("0x%04X%8s:",0xff41,&local_5d8);
      ImGui::SameLine(0.0,-1.0);
      ImGui::TextColored((ImVec4 *)local_58,"%02X ",(ulong)bVar4);
      pcVar9 = "Yi";
      if ((bVar4 & 0x40) == 0) {
        pcVar9 = "__";
      }
      if (*pcVar9 != '\0') {
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%s",pcVar9);
        bVar3 = ImGui::IsItemHovered(0);
        if (bVar3) {
          ImGui::SetTooltip("Y compare interrupt");
        }
      }
      pcVar9 = "2i";
      if ((bVar4 & 0x20) == 0) {
        pcVar9 = "__";
      }
      if (*pcVar9 != '\0') {
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%s",pcVar9);
        bVar3 = ImGui::IsItemHovered(0);
        if (bVar3) {
          ImGui::SetTooltip("Mode 2 interrupt");
        }
      }
      pcVar9 = "Vi";
      if ((bVar4 & 0x10) == 0) {
        pcVar9 = "__";
      }
      if (*pcVar9 != '\0') {
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%s",pcVar9);
        bVar3 = ImGui::IsItemHovered(0);
        if (bVar3) {
          ImGui::SetTooltip("Vblank interrupt");
        }
      }
      pcVar9 = "Hi";
      if ((bVar4 & 8) == 0) {
        pcVar9 = "__";
      }
      if (*pcVar9 != '\0') {
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%s",pcVar9);
        bVar3 = ImGui::IsItemHovered(0);
        if (bVar3) {
          ImGui::SetTooltip("Hblank interrupt");
        }
      }
      arg_01._33_7_ = uStack_5e7;
      arg_01.invert = (bool)local_5e8;
      arg_01._4_4_ = local_608._4_4_;
      arg_01._0_4_ = local_608._0_4_;
      arg_01.true_text = uStack_600;
      arg_01.false_text = local_5f8;
      arg_01.tooltip._0_4_ = (int)pcStack_5f0;
      arg_01.tooltip._4_4_ = (int)((ulong)pcStack_5f0 >> 0x20);
      args_07._8_8_ = pcVar8;
      args_07.text = (char *)0x3;
      anon_unknown.dwarf_a07a8::TextRegBits<(anonymous_namespace)::IntArg>
                ((Emulator *)(ulong)bVar4,'.',arg_01,args_07);
      anon_unknown.dwarf_a07a8::TextReg<>(((this->super_Window).d)->e,0xff42,"SCY");
      anon_unknown.dwarf_a07a8::TextReg<>(((this->super_Window).d)->e,0xff43,"SCX");
      anon_unknown.dwarf_a07a8::TextReg<>(((this->super_Window).d)->e,0xff44,"LY");
      anon_unknown.dwarf_a07a8::TextReg<>(((this->super_Window).d)->e,0xff45,"LYC");
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg>
                (((this->super_Window).d)->e,0xff47,"BGP",(DmgSwatchArg)0x0,
                 (DmgSwatchArg)0x100000000,(DmgSwatchArg)0x200000000,(DmgSwatchArg)0x300000000);
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg>
                (((this->super_Window).d)->e,0xff48,"OPB0",(DmgSwatchArg)0x1,
                 (DmgSwatchArg)0x100000001,(DmgSwatchArg)0x200000001,(DmgSwatchArg)0x300000001);
      uVar7 = 0x200000002;
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg>
                (((this->super_Window).d)->e,0xff49,"OPB1",(DmgSwatchArg)0x2,
                 (DmgSwatchArg)0x100000002,(DmgSwatchArg)0x200000002,(DmgSwatchArg)0x300000002);
      anon_unknown.dwarf_a07a8::TextReg<>(((this->super_Window).d)->e,0xff4a,"WY");
      anon_unknown.dwarf_a07a8::TextReg<>(((this->super_Window).d)->e,0xff4b,"WX");
      pDVar5 = (this->super_Window).d;
      if (pDVar5->is_cgb == true) {
        pEVar1 = pDVar5->e;
        local_608[0] = 1;
        uStack_600 = "Sw";
        local_5f8 = "_";
        pcStack_5f0 = "Speed switch";
        local_5e8 = 0;
        local_58[0] = 0x80;
        pcStack_50 = "Sp";
        local_48 = "_";
        pcStack_40 = "Current speed";
        local_38 = 0;
        local_5d8.x = 1.0;
        local_5d8.y = 0.75;
        local_5d8.z = 0.3;
        local_5d8.w = 1.0;
        snprintf(local_62,10,"[%s]","KEY1");
        bVar4 = emulator_read_u8_raw(pEVar1,0xff4d);
        ImGui::Text("0x%04X%8s:",0xff4d,local_62);
        ImGui::SameLine(0.0,-1.0);
        uVar6 = 0x99;
        ImGui::TextColored(&local_5d8,"%02X ",(ulong)bVar4);
        args_05._4_4_ = local_608._4_4_;
        args_05._0_4_ = local_608._0_4_;
        arg._33_7_ = uStack_37;
        arg.invert = (bool)local_38;
        arg._4_4_ = local_58._4_4_;
        arg._0_4_ = local_58._0_4_;
        arg.true_text = pcStack_50;
        arg.false_text = local_48;
        arg.tooltip = pcStack_40;
        args_05.true_text = uStack_600;
        args_05.false_text._0_4_ = (int)local_5f8;
        args_05.false_text._4_4_ = (int)((ulong)local_5f8 >> 0x20);
        args_05.tooltip = pcStack_5f0;
        args_05._32_4_ = (int)CONCAT71(uStack_5e7,local_5e8);
        args_05._36_4_ = (int)((uint7)uStack_5e7 >> 0x18);
        anon_unknown.dwarf_a07a8::TextRegBits<(anonymous_namespace)::BitArg>
                  ((Emulator *)(ulong)bVar4,uVar6,arg,args_05);
        args_08.mask = (char)uVar7;
        args_08._9_3_ = (int3)((ulong)uVar7 >> 8);
        args_08.shift = (int)((ulong)uVar7 >> 0x20);
        args_08.text = (char *)0x1;
        anon_unknown.dwarf_a07a8::TextReg<(anonymous_namespace)::IntArg>
                  ((anon_unknown_dwarf_a07a8 *)((this->super_Window).d)->e,(Emulator *)0xff4f,0x852a
                   ,"Bank",args_08);
        pEVar1 = ((this->super_Window).d)->e;
        local_608._0_4_ = 1.0;
        local_608._4_4_ = 0.75;
        uStack_600._0_4_ = 0.3;
        uStack_600._4_4_ = 1.0;
        pcVar8 = "HDMA5";
        snprintf(local_58,10,"[%s]");
        bVar4 = emulator_read_u8_raw(pEVar1,0xff55);
        ImGui::Text("0x%04X%8s:",0xff55,local_58);
        ImGui::SameLine(0.0,-1.0);
        ImGui::TextColored((ImVec4 *)local_608,"%02X ",(ulong)bVar4);
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%s:%d ","Mode",(ulong)(bVar4 >> 7));
        arg_02._8_8_ = pcVar8;
        arg_02.text = (char *)0x7f;
        anon_unknown.dwarf_a07a8::TextRegBits<>((Emulator *)(ulong)bVar4,'c',arg_02);
        pEVar1 = ((this->super_Window).d)->e;
        local_608[0] = 1;
        uStack_600 = "W";
        local_5f8 = "_";
        pcStack_5f0 = "Write";
        local_5e8 = 0;
        local_58[0] = 2;
        pcStack_50 = "R";
        local_48 = "_";
        pcStack_40 = "Read";
        local_38 = 0;
        local_5d8.x = 1.0;
        local_5d8.y = 0.75;
        local_5d8.z = 0.3;
        local_5d8.w = 1.0;
        snprintf(local_62,10,"[%s]","RP");
        bVar4 = emulator_read_u8_raw(pEVar1,0xff56);
        ImGui::Text("0x%04X%8s:",0xff56,local_62);
        ImGui::SameLine(0.0,-1.0);
        ImGui::TextColored(&local_5d8,"%02X ",(ulong)bVar4);
        ImGui::SameLine(0.0,-1.0);
        uVar6 = 'j';
        ImGui::Text("%s:%d ","Enable",(ulong)(bVar4 >> 6));
        args_06._4_4_ = local_608._4_4_;
        args_06._0_4_ = local_608._0_4_;
        arg_00._33_7_ = uStack_37;
        arg_00.invert = (bool)local_38;
        arg_00._4_4_ = local_58._4_4_;
        arg_00._0_4_ = local_58._0_4_;
        arg_00.true_text = pcStack_50;
        arg_00.false_text = local_48;
        arg_00.tooltip = pcStack_40;
        args_06.true_text = uStack_600;
        args_06.false_text._0_4_ = (int)local_5f8;
        args_06.false_text._4_4_ = (int)((ulong)local_5f8 >> 0x20);
        args_06.tooltip = pcStack_5f0;
        args_06._32_4_ = (int)CONCAT71(uStack_5e7,local_5e8);
        args_06._36_4_ = (int)((uint7)uStack_5e7 >> 0x18);
        anon_unknown.dwarf_a07a8::TextRegBits<(anonymous_namespace)::BitArg>
                  ((Emulator *)(ulong)bVar4,uVar6,arg_00,args_06);
        local_3d8 = 0x80;
        pcStack_3d0 = "+";
        local_3c8 = "_";
        pcStack_3c0 = "Auto-increment";
        local_3b8 = 0;
        args_03._1_7_ = uStack_3d7;
        args_03.mask = 0x80;
        args_03.true_text = "+";
        args_03.false_text = "_";
        args_03.tooltip._0_4_ = 0x1bc67c;
        args_03.tooltip._4_4_ = 0;
        args_03._32_8_ = (ulong)uStack_3b7 << 8;
        args_1_03.mask = '?';
        args_1_03._9_3_ = 0;
        args_1_03.shift = 0;
        args_1_03.text = "Index";
        (anonymous_namespace)::TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::IntArg>
                  (((this->super_Window).d)->e,0xff68,"BCPS",args_03,args_1_03);
        anon_unknown.dwarf_a07a8::TextReg<>(((this->super_Window).d)->e,0xff69,"BCPD");
        local_400 = 0x80;
        pcStack_3f8 = "+";
        local_3f0 = "_";
        pcStack_3e8 = "Auto-increment";
        local_3e0 = 0;
        args_04._1_7_ = uStack_3ff;
        args_04.mask = 0x80;
        args_04.true_text = "+";
        args_04.false_text = "_";
        args_04.tooltip._0_4_ = 0x1bc67c;
        args_04.tooltip._4_4_ = 0;
        args_04._32_8_ = (ulong)uStack_3df << 8;
        args_1_04.mask = '?';
        args_1_04._9_3_ = 0;
        args_1_04.shift = 0;
        args_1_04.text = "Index";
        (anonymous_namespace)::TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::IntArg>
                  (((this->super_Window).d)->e,0xff6a,"OCPS",args_04,args_1_04);
        anon_unknown.dwarf_a07a8::TextReg<>(((this->super_Window).d)->e,0xff6b,"OCPD");
        args_09.mask = (char)uVar7;
        args_09._9_3_ = (int3)((ulong)uVar7 >> 8);
        args_09.shift = (int)((ulong)uVar7 >> 0x20);
        args_09.text = (char *)0x7;
        anon_unknown.dwarf_a07a8::TextReg<(anonymous_namespace)::IntArg>
                  ((anon_unknown_dwarf_a07a8 *)((this->super_Window).d)->e,(Emulator *)0xff70,0x8529
                   ,"Bank",args_09);
        pDVar5 = (this->super_Window).d;
      }
      local_428 = 0x10;
      pcStack_420 = "JOYP ";
      local_418 = "";
      uStack_410 = 0;
      local_450 = 8;
      pcStack_448 = "SERIAL ";
      local_440 = "";
      uStack_438 = 0;
      local_408 = 0;
      local_478 = 4;
      pcStack_470 = "TIMER ";
      local_468 = "";
      uStack_460 = 0;
      local_430 = 0;
      local_458 = 0;
      local_4a0 = 2;
      pcStack_498 = "STAT ";
      local_490 = "";
      uStack_488 = 0;
      local_480 = 0;
      local_4c8 = 1;
      pcStack_4c0 = "VBLANK ";
      local_4b8 = "";
      uStack_4b0 = 0;
      local_4a8 = 0;
      args_4_02._1_7_ = uStack_4c7;
      args_4_02.mask = 1;
      args_3_02._1_7_ = uStack_49f;
      args_3_02.mask = 2;
      args_2_02._1_7_ = uStack_477;
      args_2_02.mask = 4;
      args_1_02._1_7_ = uStack_44f;
      args_1_02.mask = 8;
      args_02._1_7_ = uStack_427;
      args_02.mask = 0x10;
      args_02.true_text = "JOYP ";
      args_02.false_text = "";
      args_02.tooltip = (char *)0x0;
      args_02._32_8_ = (ulong)uStack_407 << 8;
      args_1_02.true_text = "SERIAL ";
      args_1_02.false_text = "";
      args_1_02.tooltip = (char *)0x0;
      args_1_02._32_8_ = (ulong)uStack_42f << 8;
      args_2_02.true_text = "TIMER ";
      args_2_02.false_text = "";
      args_2_02.tooltip = (char *)0x0;
      args_2_02._32_8_ = (ulong)uStack_457 << 8;
      args_3_02.true_text = "STAT ";
      args_3_02.false_text = "";
      args_3_02.tooltip = (char *)0x0;
      args_3_02._32_8_ = (ulong)uStack_47f << 8;
      args_4_02.true_text = "VBLANK ";
      args_4_02.false_text = "";
      args_4_02.tooltip = (char *)0x0;
      args_4_02._32_8_ = (ulong)uStack_4a7 << 8;
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg>
                (pDVar5->e,0xffff,"IE",args_02,args_1_02,args_2_02,args_3_02,args_4_02);
      pDVar5 = (this->super_Window).d;
      if (pDVar5->is_cgb == true) {
        ImGui::NewLine();
        local_4d8 = 0;
        uVar10 = 3;
        local_4d0 = 3;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 0",(CgbSwatchArg)ZEXT812(0),
                   (CgbSwatchArg)(ZEXT412(1) << 0x40),(CgbSwatchArg)(ZEXT412(2) << 0x40),
                   (CgbSwatchArg)(ZEXT412(3) << 0x40));
        local_4e8 = 0x100000000;
        args_2_03.color_index = 2;
        args_2_03.type = CGB_PALETTE_TYPE_BGCP;
        args_2_03.palette_index = 1;
        args_3_03.color_index = 3;
        args_3_03.type = CGB_PALETTE_TYPE_BGCP;
        args_3_03.palette_index = 1;
        args_1_05.color_index = 1;
        args_1_05.type = CGB_PALETTE_TYPE_BGCP;
        args_1_05.palette_index = 1;
        local_4e0 = uVar10;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 1",(CgbSwatchArg)ZEXT812(0x100000000),
                   args_1_05,args_2_03,args_3_03);
        local_4f8 = 0x200000000;
        args_2_04.color_index = 2;
        args_2_04.type = CGB_PALETTE_TYPE_BGCP;
        args_2_04.palette_index = 2;
        args_3_04.color_index = 3;
        args_3_04.type = CGB_PALETTE_TYPE_BGCP;
        args_3_04.palette_index = 2;
        args_1_06.color_index = 1;
        args_1_06.type = CGB_PALETTE_TYPE_BGCP;
        args_1_06.palette_index = 2;
        local_4f0 = uVar10;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 2",(CgbSwatchArg)ZEXT812(0x200000000),
                   args_1_06,args_2_04,args_3_04);
        local_508 = 0x300000000;
        args_2_05.color_index = 2;
        args_2_05.type = CGB_PALETTE_TYPE_BGCP;
        args_2_05.palette_index = 3;
        args_3_05.color_index = 3;
        args_3_05.type = CGB_PALETTE_TYPE_BGCP;
        args_3_05.palette_index = 3;
        args_1_07.color_index = 1;
        args_1_07.type = CGB_PALETTE_TYPE_BGCP;
        args_1_07.palette_index = 3;
        local_500 = uVar10;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 3",(CgbSwatchArg)ZEXT812(0x300000000),
                   args_1_07,args_2_05,args_3_05);
        local_518 = 0x400000000;
        args_2_06.color_index = 2;
        args_2_06.type = CGB_PALETTE_TYPE_BGCP;
        args_2_06.palette_index = 4;
        args_3_06.color_index = 3;
        args_3_06.type = CGB_PALETTE_TYPE_BGCP;
        args_3_06.palette_index = 4;
        args_1_08.color_index = 1;
        args_1_08.type = CGB_PALETTE_TYPE_BGCP;
        args_1_08.palette_index = 4;
        local_510 = uVar10;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 4",(CgbSwatchArg)ZEXT812(0x400000000),
                   args_1_08,args_2_06,args_3_06);
        local_528 = 0x500000000;
        args_2_07.color_index = 2;
        args_2_07.type = CGB_PALETTE_TYPE_BGCP;
        args_2_07.palette_index = 5;
        args_3_07.color_index = 3;
        args_3_07.type = CGB_PALETTE_TYPE_BGCP;
        args_3_07.palette_index = 5;
        args_1_09.color_index = 1;
        args_1_09.type = CGB_PALETTE_TYPE_BGCP;
        args_1_09.palette_index = 5;
        local_520 = uVar10;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 5",(CgbSwatchArg)ZEXT812(0x500000000),
                   args_1_09,args_2_07,args_3_07);
        local_538 = 0x600000000;
        args_2_08.color_index = 2;
        args_2_08.type = CGB_PALETTE_TYPE_BGCP;
        args_2_08.palette_index = 6;
        args_3_08.color_index = 3;
        args_3_08.type = CGB_PALETTE_TYPE_BGCP;
        args_3_08.palette_index = 6;
        args_1_10.color_index = 1;
        args_1_10.type = CGB_PALETTE_TYPE_BGCP;
        args_1_10.palette_index = 6;
        local_530 = uVar10;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 6",(CgbSwatchArg)ZEXT812(0x600000000),
                   args_1_10,args_2_08,args_3_08);
        local_548 = 0x700000000;
        args_2_09.color_index = 2;
        args_2_09.type = CGB_PALETTE_TYPE_BGCP;
        args_2_09.palette_index = 7;
        args_3_09.color_index = 3;
        args_3_09.type = CGB_PALETTE_TYPE_BGCP;
        args_3_09.palette_index = 7;
        args_1_11.color_index = 1;
        args_1_11.type = CGB_PALETTE_TYPE_BGCP;
        args_1_11.palette_index = 7;
        local_540 = uVar10;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 7",(CgbSwatchArg)ZEXT812(0x700000000),
                   args_1_11,args_2_09,args_3_09);
        local_558 = 1;
        args_2_10.color_index = 2;
        args_2_10.type = CGB_PALETTE_TYPE_OBCP;
        args_2_10.palette_index = 0;
        args_3_10.color_index = 3;
        args_3_10.type = CGB_PALETTE_TYPE_OBCP;
        args_3_10.palette_index = 0;
        args_1_12.color_index = 1;
        args_1_12.type = CGB_PALETTE_TYPE_OBCP;
        args_1_12.palette_index = 0;
        local_550 = uVar10;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 0",(CgbSwatchArg)ZEXT812(1),args_1_12,
                   args_2_10,args_3_10);
        local_568 = 0x100000001;
        args_2_11.color_index = 2;
        args_2_11.type = CGB_PALETTE_TYPE_OBCP;
        args_2_11.palette_index = 1;
        args_3_11.color_index = 3;
        args_3_11.type = CGB_PALETTE_TYPE_OBCP;
        args_3_11.palette_index = 1;
        args_1_13.color_index = 1;
        args_1_13.type = CGB_PALETTE_TYPE_OBCP;
        args_1_13.palette_index = 1;
        local_560 = uVar10;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 1",(CgbSwatchArg)ZEXT812(0x100000001),
                   args_1_13,args_2_11,args_3_11);
        local_578 = 0x200000001;
        args_2_12.color_index = 2;
        args_2_12.type = CGB_PALETTE_TYPE_OBCP;
        args_2_12.palette_index = 2;
        args_3_12.color_index = 3;
        args_3_12.type = CGB_PALETTE_TYPE_OBCP;
        args_3_12.palette_index = 2;
        args_1_14.color_index = 1;
        args_1_14.type = CGB_PALETTE_TYPE_OBCP;
        args_1_14.palette_index = 2;
        local_570 = uVar10;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 2",(CgbSwatchArg)ZEXT812(0x200000001),
                   args_1_14,args_2_12,args_3_12);
        local_588 = 0x300000001;
        args_2_13.color_index = 2;
        args_2_13.type = CGB_PALETTE_TYPE_OBCP;
        args_2_13.palette_index = 3;
        args_3_13.color_index = 3;
        args_3_13.type = CGB_PALETTE_TYPE_OBCP;
        args_3_13.palette_index = 3;
        args_1_15.color_index = 1;
        args_1_15.type = CGB_PALETTE_TYPE_OBCP;
        args_1_15.palette_index = 3;
        local_580 = uVar10;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 3",(CgbSwatchArg)ZEXT812(0x300000001),
                   args_1_15,args_2_13,args_3_13);
        local_598 = 0x400000001;
        uVar10 = 3;
        local_590 = 3;
        args_2_14.color_index = 2;
        args_2_14.type = CGB_PALETTE_TYPE_OBCP;
        args_2_14.palette_index = 4;
        args_3_14.color_index = 3;
        args_3_14.type = CGB_PALETTE_TYPE_OBCP;
        args_3_14.palette_index = 4;
        args_1_16.color_index = 1;
        args_1_16.type = CGB_PALETTE_TYPE_OBCP;
        args_1_16.palette_index = 4;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 4",(CgbSwatchArg)ZEXT812(0x400000001),
                   args_1_16,args_2_14,args_3_14);
        local_5a8 = 0x500000001;
        args_2_15.color_index = 2;
        args_2_15.type = CGB_PALETTE_TYPE_OBCP;
        args_2_15.palette_index = 5;
        args_3_15.color_index = 3;
        args_3_15.type = CGB_PALETTE_TYPE_OBCP;
        args_3_15.palette_index = 5;
        args_1_17.color_index = 1;
        args_1_17.type = CGB_PALETTE_TYPE_OBCP;
        args_1_17.palette_index = 5;
        local_5a0 = uVar10;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 5",(CgbSwatchArg)ZEXT812(0x500000001),
                   args_1_17,args_2_15,args_3_15);
        local_5b8 = 0x600000001;
        args_2_16.color_index = 2;
        args_2_16.type = CGB_PALETTE_TYPE_OBCP;
        args_2_16.palette_index = 6;
        args_3_16.color_index = 3;
        args_3_16.type = CGB_PALETTE_TYPE_OBCP;
        args_3_16.palette_index = 6;
        args_1_18.color_index = 1;
        args_1_18.type = CGB_PALETTE_TYPE_OBCP;
        args_1_18.palette_index = 6;
        local_5b0 = uVar10;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 6",(CgbSwatchArg)ZEXT812(0x600000001),
                   args_1_18,args_2_16,args_3_16);
        local_5c8 = 0x700000001;
        args_2_17.color_index = 2;
        args_2_17.type = CGB_PALETTE_TYPE_OBCP;
        args_2_17.palette_index = 7;
        args_3_17.color_index = 3;
        args_3_17.type = CGB_PALETTE_TYPE_OBCP;
        args_3_17.palette_index = 7;
        args_1_19.color_index = 1;
        args_1_19.type = CGB_PALETTE_TYPE_OBCP;
        args_1_19.palette_index = 7;
        local_5c0 = uVar10;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 7",(CgbSwatchArg)ZEXT812(0x700000001),
                   args_1_19,args_2_17,args_3_17);
      }
      else if (pDVar5->is_sgb == true) {
        ImGui::NewLine();
        (anonymous_namespace)::
        TextSgbPal<(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg>
                  (((this->super_Window).d)->e,"SGB Pal 0",(SgbSwatchArg)0x0,
                   (SgbSwatchArg)0x100000000,(SgbSwatchArg)0x200000000,(SgbSwatchArg)0x300000000);
        (anonymous_namespace)::
        TextSgbPal<(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg>
                  (((this->super_Window).d)->e,"SGB Pal 1",(SgbSwatchArg)0x1,
                   (SgbSwatchArg)0x100000001,(SgbSwatchArg)0x200000001,(SgbSwatchArg)0x300000001);
        (anonymous_namespace)::
        TextSgbPal<(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg>
                  (((this->super_Window).d)->e,"SGB Pal 2",(SgbSwatchArg)0x2,
                   (SgbSwatchArg)0x100000002,(SgbSwatchArg)0x200000002,(SgbSwatchArg)0x300000002);
        (anonymous_namespace)::
        TextSgbPal<(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg>
                  (((this->super_Window).d)->e,"SGB Pal 3",(SgbSwatchArg)0x3,
                   (SgbSwatchArg)0x100000003,(SgbSwatchArg)0x200000003,(SgbSwatchArg)0x300000003);
      }
    }
    ImGui::End();
  }
  return;
}

Assistant:

void Debugger::IOWindow::Tick() {
  if (!is_open) return;

  if (ImGui::Begin(Debugger::s_io_window_name, &is_open)) {
    u8 v;
    TextReg(d->e, 0xff00, "JOYP", InvBit(0x18, "D"), InvBit(0x14, "U"),
            InvBit(0x12, "L"), InvBit(0x11, "R"), InvBit(0x28, "+"),
            InvBit(0x24, "-"), InvBit(0x22, "B"), InvBit(0x21, "A"));

    TextReg(d->e, 0xff01, "SB");
    TextReg(d->e, 0xff02, "SC");
    TextReg(d->e, 0xff04, "DIV");
    TextReg(d->e, 0xff05, "TIMA");
    TextReg(d->e, 0xff06, "TMA");
    TextReg(d->e, 0xff07, "TAC", Bit(0x4, "on", "off"), Enum<TimerClock>(0x3));

    TextReg(d->e, 0xff0f, "IF", Bit0(0x10, "JOYP "), Bit0(0x8, "SERIAL "),
            Bit0(0x4, "TIMER "), Bit0(0x2, "STAT "), Bit0(0x1, "VBLANK "));

    TextReg(d->e, 0xff40, "LCDC", Bit2(0x80, "D ", "Display"),
            Bit2(0x40, "WM", "Window tile map select"),
            Bit2(0x20, "Wd", "Window display"),
            Bit2(0x10, "BD", "BG tile data select"),
            Bit2(0x08, "BM", "BG tile map select"),
            Bit2(0x04, "Os", "Obj size"), Bit2(0x02, "Od", "Obj display"),
            Bit2(0x01, "Bd", "BG display"));

    TextReg(d->e, 0xff41, "STAT", Bit2(0x40, "Yi", "Y compare interrupt"),
            Bit2(0x20, "2i", "Mode 2 interrupt"),
            Bit2(0x10, "Vi", "Vblank interrupt"),
            Bit2(0x08, "Hi", "Hblank interrupt"),
            Bit2(0x04, "Y=", "Y compare set"), Int("Mode", 0x03));

    TextReg(d->e, 0xff42, "SCY");
    TextReg(d->e, 0xff43, "SCX");
    TextReg(d->e, 0xff44, "LY");
    TextReg(d->e, 0xff45, "LYC");
    TextReg(d->e, 0xff47, "BGP", Swatch(PALETTE_TYPE_BGP, 0),
            Swatch(PALETTE_TYPE_BGP, 1), Swatch(PALETTE_TYPE_BGP, 2),
            Swatch(PALETTE_TYPE_BGP, 3));
    TextReg(d->e, 0xff48, "OPB0", Swatch(PALETTE_TYPE_OBP0, 0),
            Swatch(PALETTE_TYPE_OBP0, 1), Swatch(PALETTE_TYPE_OBP0, 2),
            Swatch(PALETTE_TYPE_OBP0, 3));
    TextReg(d->e, 0xff49, "OPB1", Swatch(PALETTE_TYPE_OBP1, 0),
            Swatch(PALETTE_TYPE_OBP1, 1), Swatch(PALETTE_TYPE_OBP1, 2),
            Swatch(PALETTE_TYPE_OBP1, 3));
    TextReg(d->e, 0xff4A, "WY");
    TextReg(d->e, 0xff4B, "WX");

    if (d->is_cgb) {
      TextReg(d->e, 0xff4d, "KEY1", Bit1(0x80, "Sp", "Current speed"),
              Bit1(0x1, "Sw", "Speed switch"));
      TextReg(d->e, 0xff4f, "VBK", Int("Bank", 0x1));
      TextReg(d->e, 0xff55, "HDMA5", Int("Mode", 0x80, 7), Int("Blocks", 0x7f));
      TextReg(d->e, 0xff56, "RP", Int("Enable", 0xc0, 6),
              Bit1(0x2, "R", "Read"), Bit1(0x01, "W", "Write"));

      TextReg(d->e, 0xff68, "BCPS", Bit1(0x80, "+", "Auto-increment"),
              Int("Index", 0x3f));
      TextReg(d->e, 0xff69, "BCPD");
      TextReg(d->e, 0xff6a, "OCPS", Bit1(0x80, "+", "Auto-increment"),
              Int("Index", 0x3f));
      TextReg(d->e, 0xff6b, "OCPD");
      TextReg(d->e, 0xff70, "SVBK", Int("Bank", 0x7));
    }

    TextReg(d->e, 0xffff, "IE", Bit0(0x10, "JOYP "), Bit0(0x8, "SERIAL "),
            Bit0(0x4, "TIMER "), Bit0(0x2, "STAT "), Bit0(0x1, "VBLANK "));

    if (d->is_cgb) {
      ImGui::NewLine();
      TextCgbPal(d->e, "CGB BG Pal 0", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 0, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 0, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 0, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 0, 3));
      TextCgbPal(d->e, "CGB BG Pal 1", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 1, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 1, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 1, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 1, 3));
      TextCgbPal(d->e, "CGB BG Pal 2", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 2, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 2, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 2, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 2, 3));
      TextCgbPal(d->e, "CGB BG Pal 3", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 3, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 3, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 3, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 3, 3));
      TextCgbPal(d->e, "CGB BG Pal 4", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 4, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 4, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 4, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 4, 3));
      TextCgbPal(d->e, "CGB BG Pal 5", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 5, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 5, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 5, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 5, 3));
      TextCgbPal(d->e, "CGB BG Pal 6", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 6, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 6, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 6, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 6, 3));
      TextCgbPal(d->e, "CGB BG Pal 7", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 7, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 7, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 7, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 7, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 0", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 0, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 0, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 0, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 0, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 1", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 1, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 1, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 1, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 1, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 2", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 2, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 2, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 2, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 2, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 3", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 3, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 3, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 3, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 3, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 4", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 4, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 4, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 4, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 4, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 5", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 5, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 5, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 5, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 5, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 6", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 6, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 6, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 6, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 6, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 7", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 7, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 7, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 7, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 7, 3));
    } else if (d->is_sgb) {
      ImGui::NewLine();
      TextSgbPal(d->e, "SGB Pal 0", SgbSwatch(0, 0), SgbSwatch(0, 1),
                 SgbSwatch(0, 2), SgbSwatch(0, 3));
      TextSgbPal(d->e, "SGB Pal 1", SgbSwatch(1, 0), SgbSwatch(1, 1),
                 SgbSwatch(1, 2), SgbSwatch(1, 3));
      TextSgbPal(d->e, "SGB Pal 2", SgbSwatch(2, 0), SgbSwatch(2, 1),
                 SgbSwatch(2, 2), SgbSwatch(2, 3));
      TextSgbPal(d->e, "SGB Pal 3", SgbSwatch(3, 0), SgbSwatch(3, 1),
                 SgbSwatch(3, 2), SgbSwatch(3, 3));
    }
  }
  ImGui::End();
}